

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O1

void TPZShapeHDivConstant<pzshape::TPZShapeTetra>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int d_1;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int d_2;
  ulong uVar7;
  long lVar8;
  int d;
  long lVar9;
  long lVar10;
  TPZVec<double> div;
  TPZFMatrix<double> curlPhiAux;
  TPZFMatrix<double> phiAux;
  TPZFNMatrix<12,_double> vecDiv;
  ulong local_2b0;
  ulong local_2a8;
  long local_2a0;
  long local_270;
  TPZVec<double> local_268;
  TPZFMatrix<double> local_248;
  TPZFMatrix<double> local_1b8;
  TPZFMatrix<double> local_128;
  double local_98 [13];
  
  local_128.fElem = local_98;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018aee30;
  local_128.fSize = 0xc;
  local_128.fGiven = local_128.fElem;
  TPZVec<int>::TPZVec(&local_128.fPivot.super_TPZVec<int>,0);
  local_128.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_128.fPivot.super_TPZVec<int>.fStore = local_128.fPivot.fExtAlloc;
  local_128.fPivot.super_TPZVec<int>.fNElements = 0;
  local_128.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_128.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_128.fWork.fStore = (double *)0x0;
  local_128.fWork.fNElements = 0;
  local_128.fWork.fNAlloc = 0;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018aeb40;
  TPZVec<double>::TPZVec(&local_268,4);
  memset(local_128.fElem,0,
         local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
       local_128.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZVec<double>::Fill(&local_268,(double *)&local_1b8,0,-1);
  pztopology::TPZTetrahedron::ComputeConstantHDiv(pt,&local_128,&local_268);
  (*(divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (divphi);
  uVar1 = pztopology::TPZTetrahedron::NumSides(1);
  local_2a8 = (ulong)uVar1;
  iVar2 = TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::NHCurlShapeF(data);
  lVar6 = (long)iVar2;
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_1b8.fElem = (double *)0x0;
  local_1b8.fGiven = (double *)0x0;
  local_1b8.fSize = 0;
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar6;
  TPZVec<int>::TPZVec(&local_1b8.fPivot.super_TPZVec<int>,0);
  local_1b8.fPivot.super_TPZVec<int>.fStore = local_1b8.fPivot.fExtAlloc;
  local_1b8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1b8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1b8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1b8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1b8.fWork.fStore = (double *)0x0;
  local_1b8.fWork.fNElements = 0;
  local_1b8.fWork.fNAlloc = 0;
  if (iVar2 != 0) {
    uVar5 = 0xffffffffffffffff;
    if ((ulong)(lVar6 * 3) < 0x2000000000000000) {
      uVar5 = lVar6 * 0x18;
    }
    local_1b8.fElem = (double *)operator_new__(uVar5);
  }
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_248.fElem = (double *)0x0;
  local_248.fGiven = (double *)0x0;
  local_248.fSize = 0;
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar6;
  TPZVec<int>::TPZVec(&local_248.fPivot.super_TPZVec<int>,0);
  local_248.fPivot.super_TPZVec<int>.fStore = local_248.fPivot.fExtAlloc;
  local_248.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_248.fPivot.super_TPZVec<int>.fNElements = 0;
  local_248.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_248.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_248.fWork.fStore = (double *)0x0;
  local_248.fWork.fNElements = 0;
  local_248.fWork.fNAlloc = 0;
  if (iVar2 != 0) {
    uVar5 = 0xffffffffffffffff;
    if ((ulong)(lVar6 * 3) < 0x2000000000000000) {
      uVar5 = lVar6 * 0x18;
    }
    local_248.fElem = (double *)operator_new__(uVar5);
  }
  memset(local_1b8.fElem,0,
         local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
       local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
  memset(local_248.fElem,0,
         local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  local_2b0 = 0;
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
       local_248.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
  TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::Shape(pt,data,&local_1b8,&local_248);
  local_270 = 0;
  local_2a0 = 0;
  do {
    lVar6 = (long)(int)local_2b0;
    lVar9 = 0;
    do {
      if ((local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
         (local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= local_2a0)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9) ||
          ((int)local_2b0 < 0)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6 + lVar9] =
           *(double *)
            ((long)local_128.fElem +
            lVar9 * 8 + local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_270) *
           (double)(data->fSideOrient).super_TPZVec<int>.fStore[local_2a0];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    if ((((int)local_2b0 < 0) ||
        ((divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
       ((divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    divphi->fElem[lVar6] =
         local_268.fStore[local_2a0] *
         (double)(data->fSideOrient).super_TPZVec<int>.fStore[local_2a0];
    uVar3 = (int)local_2b0 + 1;
    uVar5 = (ulong)uVar3;
    if (0 < (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[(int)uVar1]) {
      local_2a8 = (ulong)(int)local_2a8;
      lVar6 = local_2a8 * 8;
      lVar9 = (long)(int)uVar3 * 8;
      iVar2 = 0;
      uVar5 = (long)(int)uVar3;
      do {
        uVar7 = uVar5;
        lVar4 = 0;
        do {
          if (((local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar4) ||
              ((long)local_2a8 < 0)) ||
             (local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)local_2a8)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar4) ||
              ((int)local_2b0 < -1)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(undefined8 *)
           ((long)phi->fElem +
           lVar4 * 8 + (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9) =
               *(undefined8 *)
                ((long)local_248.fElem +
                lVar4 * 8 + local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_2a8 = local_2a8 + 1;
        iVar2 = iVar2 + 1;
        lVar6 = lVar6 + 8;
        lVar9 = lVar9 + 8;
        uVar5 = uVar7 + 1;
        local_2b0 = uVar7;
      } while (iVar2 < (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[(int)uVar1]);
    }
    local_2b0 = uVar5;
    local_2a0 = local_2a0 + 1;
    local_270 = local_270 + 8;
  } while (local_2a0 != 4);
  if (0 < (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[10]) {
    lVar4 = (long)(int)local_2a8;
    lVar10 = (long)(int)local_2b0;
    lVar6 = lVar4 * 8;
    lVar9 = lVar10 * 8;
    iVar2 = 0;
    do {
      lVar8 = 0;
      do {
        if (((local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) || (lVar4 < 0))
           || (local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) || (lVar10 < 0)) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)phi->fElem +
         lVar8 * 8 + (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9) =
             *(undefined8 *)
              ((long)local_248.fElem +
              lVar8 * 8 + local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
      lVar10 = lVar10 + 1;
      iVar2 = iVar2 + 1;
      lVar6 = lVar6 + 8;
      lVar9 = lVar9 + 8;
    } while (iVar2 < (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[10]);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_248);
  TPZFMatrix<double>::~TPZFMatrix(&local_1b8);
  local_268._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_268.fStore != (double *)0x0) {
    operator_delete__(local_268.fStore);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_128,&PTR_PTR_018aedf8);
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    const int nfacets = TSHAPE::NFacets;

    // Compute constant Hdiv functions
    TPZFNMatrix<12,REAL> vecDiv(dim,nfacets);
    TPZVec<REAL> div(nfacets);
    vecDiv.Zero();
    div.Fill(0.);
    // std::cout << "FSide trans ID = " << data.fSideTransformationId << std::endl;
    TSHAPE::ComputeConstantHDiv(pt, vecDiv, div);

    int nshape = data.fPhi.Rows();
    
    if (dim == 2){
        TPZShapeH1<TSHAPE>::Shape(pt,data);    
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);

        int count = 0;
        int countKernel=ncorner;
        //Edge functions
        for (int i = 0; i < nEdges; i++)
        {
            //RT0 Function
            phi(0,count) = vecDiv(0,i) * data.fSideOrient[i];
            phi(1,count) = vecDiv(1,i) * data.fSideOrient[i];
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;

            //Kernel Hdiv
            for (int j = 1; j < data.fHDivConnectOrders[i]; j++)
            {
                phi(0,count) = -data.fDPhi(1,countKernel);
                phi(1,count) =  data.fDPhi(0,countKernel);
                count++;
                countKernel++;
            }
        }
        
        //Internal functions
        for (int i = countKernel; i < nshape; i++){
            phi(0,count) = -data.fDPhi(1,countKernel);
            phi(1,count) =  data.fDPhi(0,countKernel);
            count++;
            countKernel++;
        }
    } else if (dim == 3){
        
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);
        int nshapehcurl = TPZShapeHCurlNoGrads<TSHAPE>::NHCurlShapeF(data);
        int nshape = NHDivShapeF(data);
        
        TPZFMatrix<REAL> phiAux(dim,nshapehcurl),curlPhiAux(3,nshapehcurl);
        phiAux.Zero(); curlPhiAux.Zero();

        TPZShapeHCurlNoGrads<TSHAPE>::Shape(pt,data,phiAux,curlPhiAux);
        
        int count = 0;
        int countKernel=nEdges;

        //Face functions
        for (int i = 0; i < nfacets; i++)
        {
            // std::cout << "Side orient - " << i << " " << data.fSideOrient[i] << std::endl;
            //RT0 Function
            for(auto d = 0; d < dim; d++) {
                phi(d,count) = vecDiv(d,i) * data.fSideOrient[i];
            }
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;
        
            //Kernel HDiv functions
            for (int k = 0; k < data.fHDivNumConnectShape[nEdges]; k++){
                for(auto d = 0; d < dim; d++) {
                    phi(d,count) = curlPhiAux(d,countKernel);               
                }
                countKernel++;
                count++;
            }
        }
        //Internal Functions - HDivKernel
        for (int i = 0; i < data.fHDivNumConnectShape[TSHAPE::NSides-TSHAPE::NCornerNodes-1]; i++)
        {
            for (auto d = 0; d < dim; d++)
            {
                phi(d,count) = curlPhiAux(d,countKernel);  
            }
            countKernel++;
            count++;
        }
        // std::cout << "VecDiv = " << vecDiv << std::endl;
        // std::cout << "divphi = " << divphi << std::endl;
        // std::cout << "phi = " << phi << std::endl;
    } else {
        DebugStop();
    }
    

}